

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_header(AMQP_VALUE value,HEADER_HANDLE *header_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  HEADER_HANDLE pHVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  _Bool first_acquirer;
  uint8_t priority;
  _Bool durable;
  uint32_t delivery_count;
  milliseconds ttl;
  uint local_40;
  _Bool local_3b;
  uchar local_3a;
  _Bool local_39;
  uint32_t local_38;
  uint32_t local_34;
  
  pHVar4 = (HEADER_HANDLE)malloc(8);
  if (pHVar4 == (HEADER_HANDLE)0x0) {
    *header_handle = (HEADER_HANDLE)0x0;
    iVar3 = 0x390a;
  }
  else {
    pHVar4->composite_value = (AMQP_VALUE)0x0;
    *header_handle = pHVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      header_destroy(*header_handle);
      iVar3 = 0x3912;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_40);
      iVar3 = 0x3919;
      if (iVar1 == 0) {
        if ((local_40 != 0) &&
           (pAVar6 = amqpvalue_get_list_item(pAVar5,0), pAVar6 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar6);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar3 = amqpvalue_get_boolean(pAVar6,&local_39), iVar3 != 0)) {
            amqpvalue_destroy(pAVar6);
            header_destroy(*header_handle);
            return 0x3935;
          }
          amqpvalue_destroy(pAVar6);
        }
        if ((1 < local_40) &&
           (pAVar6 = amqpvalue_get_list_item(pAVar5,1), pAVar6 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar6);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar3 = amqpvalue_get_ubyte(pAVar6,&local_3a), iVar3 != 0)) {
            amqpvalue_destroy(pAVar6);
            header_destroy(*header_handle);
            return 0x3952;
          }
          amqpvalue_destroy(pAVar6);
        }
        if ((2 < local_40) &&
           (pAVar6 = amqpvalue_get_list_item(pAVar5,2), pAVar6 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar6);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar3 = amqpvalue_get_uint(pAVar6,&local_34), iVar3 != 0)) {
            amqpvalue_destroy(pAVar6);
            header_destroy(*header_handle);
            return 0x396f;
          }
          amqpvalue_destroy(pAVar6);
        }
        if ((3 < local_40) &&
           (pAVar6 = amqpvalue_get_list_item(pAVar5,3), pAVar6 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar6);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar3 = amqpvalue_get_boolean(pAVar6,&local_3b), iVar3 != 0)) {
            amqpvalue_destroy(pAVar6);
            header_destroy(*header_handle);
            return 0x398c;
          }
          amqpvalue_destroy(pAVar6);
        }
        if ((4 < local_40) &&
           (pAVar5 = amqpvalue_get_list_item(pAVar5,4), pAVar5 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar5);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar3 = amqpvalue_get_uint(pAVar5,&local_38), iVar3 != 0)) {
            amqpvalue_destroy(pAVar5);
            header_destroy(*header_handle);
            return 0x39a9;
          }
          amqpvalue_destroy(pAVar5);
        }
        pAVar5 = amqpvalue_clone(value);
        pHVar4->composite_value = pAVar5;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_header(AMQP_VALUE value, HEADER_HANDLE* header_handle)
{
    int result;
    HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header_create_internal();
    *header_handle = header_instance;
    if (*header_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            header_destroy(*header_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* durable */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool durable;
                                if (amqpvalue_get_boolean(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* priority */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint8_t priority;
                                if (amqpvalue_get_ubyte(item_value, &priority) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* ttl */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                milliseconds ttl;
                                if (amqpvalue_get_milliseconds(item_value, &ttl) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* first-acquirer */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool first_acquirer;
                                if (amqpvalue_get_boolean(item_value, &first_acquirer) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* delivery-count */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t delivery_count;
                                if (amqpvalue_get_uint(item_value, &delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    header_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}